

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSparseMatrixEigenExtensions.h
# Opt level: O3

void __thiscall
Eigen::SparseMatrix<double,_1,_int>::setZeroValues(SparseMatrix<double,_1,_int> *this)

{
  long lVar1;
  Scalar *pSVar2;
  StorageIndex *pSVar3;
  StorageIndex *pSVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  lVar1 = this->m_outerSize;
  if (0 < lVar1) {
    pSVar2 = (this->m_data).m_values;
    pSVar3 = this->m_outerIndex;
    pSVar4 = this->m_innerNonZeros;
    lVar7 = 0;
    do {
      lVar5 = (long)pSVar3[lVar7];
      if (pSVar4 == (StorageIndex *)0x0) {
        lVar6 = (long)pSVar3[lVar7 + 1];
      }
      else {
        lVar6 = pSVar4[lVar7] + lVar5;
      }
      if (lVar6 - lVar5 != 0 && lVar5 <= lVar6) {
        memset(pSVar2 + lVar5,0,(lVar6 - lVar5) * 8);
      }
      lVar7 = lVar7 + 1;
    } while (lVar1 != lVar7);
  }
  return;
}

Assistant:

void setZeroValues() {
    for (int k = 0; k < outerSize(); ++k) {
        for (InnerIterator it(*this, k); it; ++it) {
            it.valueRef() = 0.0;
        }
    }
}